

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O3

void __thiscall SFFile::LoadSample(SFFile *this,SFSample *sample)

{
  DWORD DVar1;
  FileReader *pFVar2;
  float *pfVar3;
  ulong uVar4;
  BYTE samp_1;
  SWORD samp;
  byte local_2b;
  short local_2a;
  
  pFVar2 = PathExpander::openFileReader
                     ((PathExpander *)Timidity::pathExpander,(this->super_FontFile).Filename.Chars,
                      (int *)0x0);
  if (pFVar2 != (FileReader *)0x0) {
    DVar1 = sample->Start;
    pfVar3 = (float *)operator_new__((ulong)((sample->End - DVar1) + 1) << 2);
    sample->InMemoryData = pfVar3;
    uVar4 = 0;
    (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[4])
              (pFVar2,(ulong)(DVar1 * 2 + this->SampleDataOffset),0);
    DVar1 = sample->End;
    if (DVar1 != sample->Start) {
      uVar4 = 0;
      do {
        (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar2,&local_2a,2);
        sample->InMemoryData[uVar4] = (float)(int)local_2a * 3.0517578e-05;
        uVar4 = uVar4 + 1;
        DVar1 = sample->Start;
      } while (uVar4 < sample->End - DVar1);
    }
    if (this->SampleDataLSBOffset != 0) {
      uVar4 = 0;
      (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[4])
                (pFVar2,(ulong)(this->SampleDataLSBOffset + DVar1),0);
      if (sample->End != sample->Start) {
        uVar4 = 0;
        do {
          (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar2,&local_2b,1);
          sample->InMemoryData[uVar4] =
               (float)((int)((uint)local_2b << 8 |
                            (int)(sample->InMemoryData[uVar4] * 32768.0) << 0x10) >> 8) *
               1.1920929e-07;
          uVar4 = uVar4 + 1;
        } while (uVar4 < sample->End - sample->Start);
      }
    }
    sample->InMemoryData[uVar4] = 0.0;
    (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[1])(pFVar2);
  }
  return;
}

Assistant:

void SFFile::LoadSample(SFSample *sample)
{
	FileReader *fp = pathExpander.openFileReader(Filename, NULL);
	DWORD i;

	if (fp == NULL)
	{
		return;
	}
	sample->InMemoryData = new float[sample->End - sample->Start + 1];
	fp->Seek(SampleDataOffset + sample->Start * 2, SEEK_SET);
	// Load 16-bit sample data.
	for (i = 0; i < sample->End - sample->Start; ++i)
	{
		SWORD samp;
		*fp >> samp;
		sample->InMemoryData[i] = samp / 32768.f;
	}
	if (SampleDataLSBOffset != 0)
	{ // Load lower 8 bits of 24-bit sample data.
		fp->Seek(SampleDataLSBOffset + sample->Start, SEEK_SET);
		for (i = 0; i < sample->End - sample->Start; ++i)
		{
			BYTE samp;
			*fp >> samp;
			sample->InMemoryData[i] = ((((SDWORD(sample->InMemoryData[i] * 32768) << 8) | samp) << 8) >> 8) / 8388608.f;
		}
	}
	// Final 0 byte is for interpolation.
	sample->InMemoryData[i] = 0;
	delete fp;
}